

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::MakeEchoProgress(cmMakefileTargetGenerator *this,EchoProgress *progress)

{
  ostream *poVar1;
  ostringstream progressArg;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this->LocalGenerator);
  std::__cxx11::string::assign((char *)progress);
  std::__cxx11::string::append((char *)progress);
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"$(CMAKE_PROGRESS_");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&progress->Arg,local_1b0);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void cmMakefileTargetGenerator::MakeEchoProgress(
  cmLocalUnixMakefileGenerator3::EchoProgress& progress) const
{
  progress.Dir = this->LocalGenerator->GetBinaryDirectory();
  progress.Dir += cmake::GetCMakeFilesDirectory();
  std::ostringstream progressArg;
  progressArg << "$(CMAKE_PROGRESS_" << this->NumberOfProgressActions << ")";
  progress.Arg = progressArg.str();
}